

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

PollResult __thiscall
Fossilize::ExternalReplayer::Impl::poll_progress(Impl *this,Progress *progress)

{
  __int_type _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  SharedControlBlock *pSVar4;
  __pid_t _Var5;
  uint uVar6;
  int iVar7;
  PollResult PVar8;
  int *piVar9;
  size_t __n;
  size_t i;
  ulong uVar10;
  void *__src;
  bool bVar11;
  char buf [64];
  
  _Var1 = (this->shm_block->progress_complete).super___atomic_base<unsigned_int>._M_i;
  _Var5 = this->pid;
  if (_Var1 == 0 && _Var5 < 0) {
    return Error;
  }
  if (-1 < _Var5 && _Var1 == 0) {
    _Var5 = waitpid(_Var5,&this->wstatus,1);
    if (_Var5 < 1) {
      if (-1 < _Var5) goto LAB_00176a59;
      piVar9 = __errno_location();
      this->wstatus = -*piVar9;
      this->synthesized_exit_code = true;
    }
    else {
      uVar6 = this->wstatus & 0x7f;
      if ((uVar6 != 0) && ((int)(uVar6 * 0x1000000 + 0x1000000) < 0x2000000)) goto LAB_00176a59;
    }
    reset_pid(this);
  }
LAB_00176a59:
  if ((this->shm_block->progress_started).super___atomic_base<unsigned_int>._M_i == 0) {
    PVar8 = ResultNotReady;
  }
  else {
    pSVar4 = this->shm_block;
    (progress->compute).total = (pSVar4->total_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).parsed = (pSVar4->parsed_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).parsed_fail =
         (pSVar4->parsed_compute_failures).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).skipped = (pSVar4->skipped_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).cached = (pSVar4->cached_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->compute).completed =
         (pSVar4->successful_compute).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).total = (pSVar4->total_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).parsed = (pSVar4->parsed_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).parsed_fail =
         (pSVar4->parsed_graphics_failures).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).skipped = (pSVar4->skipped_graphics).super___atomic_base<unsigned_int>._M_i
    ;
    (progress->graphics).cached = (pSVar4->cached_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->graphics).completed =
         (pSVar4->successful_graphics).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).total = (pSVar4->total_raytracing).super___atomic_base<unsigned_int>._M_i
    ;
    (progress->raytracing).parsed =
         (pSVar4->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).parsed_fail =
         (pSVar4->parsed_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).skipped =
         (pSVar4->skipped_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).cached =
         (pSVar4->cached_raytracing).super___atomic_base<unsigned_int>._M_i;
    (progress->raytracing).completed =
         (pSVar4->successful_raytracing).super___atomic_base<unsigned_int>._M_i;
    progress->completed_modules =
         (pSVar4->successful_modules).super___atomic_base<unsigned_int>._M_i;
    progress->missing_modules =
         (pSVar4->parsed_module_failures).super___atomic_base<unsigned_int>._M_i;
    progress->total_modules = (pSVar4->total_modules).super___atomic_base<unsigned_int>._M_i;
    progress->banned_modules = (pSVar4->banned_modules).super___atomic_base<unsigned_int>._M_i;
    progress->module_validation_failures =
         (pSVar4->module_validation_failures).super___atomic_base<unsigned_int>._M_i;
    progress->clean_crashes = (pSVar4->clean_process_deaths).super___atomic_base<unsigned_int>._M_i;
    progress->dirty_crashes = (pSVar4->dirty_process_deaths).super___atomic_base<unsigned_int>._M_i;
    progress->total_graphics_pipeline_blobs =
         (pSVar4->static_total_count_graphics).super___atomic_base<unsigned_int>._M_i;
    progress->total_compute_pipeline_blobs =
         (pSVar4->static_total_count_compute).super___atomic_base<unsigned_int>._M_i;
    progress->total_raytracing_pipeline_blobs =
         (pSVar4->static_total_count_raytracing).super___atomic_base<unsigned_int>._M_i;
    LOCK();
    iVar7 = pSVar4->futex_lock;
    bVar11 = iVar7 == 0;
    if (bVar11) {
      pSVar4->futex_lock = 1;
      iVar7 = 0;
    }
    UNLOCK();
    if (!bVar11) {
      piVar9 = &pSVar4->futex_lock;
      do {
        if (iVar7 == 2) {
LAB_00176b7a:
          syscall(0xca,piVar9,0,2,0,0,0);
        }
        else {
          LOCK();
          iVar7 = *piVar9;
          if (iVar7 == 1) {
            *piVar9 = 2;
            iVar7 = 1;
          }
          UNLOCK();
          if (iVar7 != 0) goto LAB_00176b7a;
        }
        LOCK();
        iVar7 = *piVar9;
        bVar11 = iVar7 == 0;
        if (bVar11) {
          *piVar9 = 2;
          iVar7 = 0;
        }
        UNLOCK();
      } while (!bVar11);
    }
    uVar2 = this->shm_block->write_count;
    uVar3 = this->shm_block->read_count;
    for (uVar10 = 0x40; uVar10 <= uVar2 - uVar3; uVar10 = uVar10 + 0x40) {
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      pSVar4 = this->shm_block;
      if ((0x3f < pSVar4->ring_buffer_size) && (0x3f < pSVar4->write_count - pSVar4->read_count)) {
        __src = (void *)((long)&pSVar4->version_cookie + (ulong)pSVar4->ring_buffer_offset);
        uVar6 = pSVar4->ring_buffer_size - pSVar4->read_offset;
        __n = 0x40;
        if (uVar6 < 0x40) {
          __n = (size_t)uVar6;
        }
        memcpy(buf,(void *)((ulong)pSVar4->read_offset + (long)__src),__n);
        if (uVar6 < 0x40) {
          memcpy(buf + __n,__src,(ulong)(0x40 - (int)__n));
        }
        pSVar4->read_offset = pSVar4->ring_buffer_size - 1 & pSVar4->read_offset + 0x40;
        pSVar4->read_count = pSVar4->read_count + 0x40;
      }
      parse_message(this,buf);
    }
    pSVar4 = this->shm_block;
    LOCK();
    piVar9 = &pSVar4->futex_lock;
    iVar7 = *piVar9;
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (iVar7 == 2) {
      piVar9 = &pSVar4->futex_lock;
      LOCK();
      *piVar9 = 0;
      UNLOCK();
      syscall(0xca,piVar9,1,1,0,0,0);
    }
    PVar8 = (PollResult)(_Var1 != 0);
  }
  return PVar8;
}

Assistant:

ExternalReplayer::PollResult ExternalReplayer::Impl::poll_progress(ExternalReplayer::Progress &progress)
{
	bool complete = shm_block->progress_complete.load(std::memory_order_acquire) != 0;

	if (pid < 0 && !complete)
		return ExternalReplayer::PollResult::Error;

	// Try to avoid a situation where we're endlessly polling, in case the application died too early during startup and we failed
	// to catch it ending by receiving a completed wait through is_process_complete().
	if (!complete && pid >= 0)
	{
		int ret;
		// This serves as a check to see if process is still alive.
		if ((ret = waitpid(pid, &wstatus, WNOHANG)) > 0)
		{
			// Child process can receive SIGCONT/SIGSTOP which is benign.
			// This should normally only happen when the process is being debugged.
			if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
				reset_pid();
		}
		else if (ret < 0)
		{
			// The child does not exist anymore, and we were unable to reap it.
			// This can happen if the process installed a SIGCHLD handler behind our back.
			wstatus = -errno;
			synthesized_exit_code = true;
			reset_pid();
		}

		// If ret is 0, that means the process is still alive and nothing happened to it yet.
	}

	if (shm_block->progress_started.load(std::memory_order_acquire) == 0)
		return ExternalReplayer::PollResult::ResultNotReady;

	progress.compute.total = shm_block->total_compute.load(std::memory_order_relaxed);
	progress.compute.parsed = shm_block->parsed_compute.load(std::memory_order_relaxed);
	progress.compute.parsed_fail = shm_block->parsed_compute_failures.load(std::memory_order_relaxed);
	progress.compute.skipped = shm_block->skipped_compute.load(std::memory_order_relaxed);
	progress.compute.cached = shm_block->cached_compute.load(std::memory_order_relaxed);
	progress.compute.completed = shm_block->successful_compute.load(std::memory_order_relaxed);

	progress.graphics.total = shm_block->total_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed = shm_block->parsed_graphics.load(std::memory_order_relaxed);
	progress.graphics.parsed_fail = shm_block->parsed_graphics_failures.load(std::memory_order_relaxed);
	progress.graphics.skipped = shm_block->skipped_graphics.load(std::memory_order_relaxed);
	progress.graphics.cached = shm_block->cached_graphics.load(std::memory_order_relaxed);
	progress.graphics.completed = shm_block->successful_graphics.load(std::memory_order_relaxed);

	progress.raytracing.total = shm_block->total_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.parsed_fail = shm_block->parsed_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.skipped = shm_block->skipped_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.cached = shm_block->cached_raytracing.load(std::memory_order_relaxed);
	progress.raytracing.completed = shm_block->successful_raytracing.load(std::memory_order_relaxed);

	progress.completed_modules = shm_block->successful_modules.load(std::memory_order_relaxed);
	progress.missing_modules = shm_block->parsed_module_failures.load(std::memory_order_relaxed);
	progress.total_modules = shm_block->total_modules.load(std::memory_order_relaxed);
	progress.banned_modules = shm_block->banned_modules.load(std::memory_order_relaxed);
	progress.module_validation_failures = shm_block->module_validation_failures.load(std::memory_order_relaxed);
	progress.clean_crashes = shm_block->clean_process_deaths.load(std::memory_order_relaxed);
	progress.dirty_crashes = shm_block->dirty_process_deaths.load(std::memory_order_relaxed);

	progress.total_graphics_pipeline_blobs = shm_block->static_total_count_graphics.load(std::memory_order_relaxed);
	progress.total_compute_pipeline_blobs = shm_block->static_total_count_compute.load(std::memory_order_relaxed);
	progress.total_raytracing_pipeline_blobs = shm_block->static_total_count_raytracing.load(std::memory_order_relaxed);

	futex_wrapper_lock(&shm_block->futex_lock);
	size_t read_avail = shared_control_block_read_avail(shm_block);
	for (size_t i = ControlBlockMessageSize; i <= read_avail; i += ControlBlockMessageSize)
	{
		char buf[ControlBlockMessageSize] = {};
		shared_control_block_read(shm_block, buf, sizeof(buf));
		parse_message(buf);
	}
	futex_wrapper_unlock(&shm_block->futex_lock);
	return complete ? ExternalReplayer::PollResult::Complete : ExternalReplayer::PollResult::Running;
}